

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer-CH.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pIVar1;
  __pid_t _Var2;
  ostream *poVar3;
  istream *piVar4;
  size_type __n;
  Tensor *pTVar5;
  uint i;
  uint uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Instance *sent;
  pointer chars;
  bool bVar10;
  undefined1 auVar11 [16];
  real rVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 in_XMM3 [16];
  uint toverall;
  double local_918;
  char **argv_local;
  MomentumSGDTrainer *local_908;
  int local_900;
  uint local_8fc;
  uint doverall;
  uint dpredict;
  uint tpredict;
  int argc_local;
  vector<Instance,_std::allocator<Instance>_> training;
  double local_8d0;
  double dcorr;
  double correct;
  int total;
  string fname;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  Model model;
  vector<Instance,_std::allocator<Instance>_> dev;
  string line;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  y;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_718;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_700;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_6e8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_6d0;
  ostringstream os;
  RNNLanguageModel<cnn::FastLSTMBuilder> lm;
  ifstream in_2;
  
  argv_local = argv;
  argc_local = argc;
  cnn::Initialize(&argc_local,&argv_local,0x7c5,false);
  if (argc_local - 5U < 0xfffffffe) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv_local);
    std::operator<<(poVar3," corpus.txt dev.txt [model.params]\n");
    return 1;
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  line._M_string_length = 0;
  training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  poVar3 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
  poVar3 = std::operator<<(poVar3,argv_local[1]);
  std::operator<<(poVar3,"...\n");
  total = 0;
  fname._M_dataplus._M_p._0_4_ = 0;
  std::ifstream::ifstream(&lm,argv_local[1],_S_in);
  if ((*(byte *)((long)&lm.p_wordpadding1 +
                *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) == 0) {
    iVar8 = 0;
    iVar9 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&lm,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,iVar9);
        poVar3 = std::operator<<(poVar3," lines, ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3," tokens, ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," types\n");
        poVar3 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(float)(int)fname._M_dataplus._M_p / (float)total);
        std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<((ostream *)&std::cerr,"Tags: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::ifstream::~ifstream(&lm);
        wd.frozen = true;
        std::__cxx11::string::string((string *)&lm,"*UNK*",(allocator *)&in_2);
        cnn::Dict::SetUnk(&wd,(string *)&lm);
        std::__cxx11::string::~string((string *)&lm);
        std::__cxx11::string::string((string *)&lm,"NULL",(allocator *)&in_2);
        endlabel = cnn::Dict::Convert(&ld,(string *)&lm);
        std::__cxx11::string::~string((string *)&lm);
        ld.frozen = true;
        cd.frozen = true;
        std::__cxx11::string::string((string *)&lm,"*UNK*",(allocator *)&in_2);
        cnn::Dict::SetUnk(&cd,(string *)&lm);
        std::__cxx11::string::~string((string *)&lm);
        std::__cxx11::string::string((string *)&lm,"*UNK*",(allocator *)&in_2);
        cnn::Dict::SetUnk(&ld,(string *)&lm);
        std::__cxx11::string::~string((string *)&lm);
        VOCAB_SIZE = (uint)((ulong)((long)wd.words_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)wd.words_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
        CHAR_SIZE = (uint)((ulong)((long)cd.words_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)cd.words_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5);
        LABEL_SIZE = (uint)((ulong)((long)ld.words_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ld.words_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
        poVar3 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
        poVar3 = std::operator<<(poVar3,argv_local[2]);
        std::operator<<(poVar3,"...\n");
        total = 0;
        fname._M_dataplus._M_p._0_4_ = 0;
        std::ifstream::ifstream(&lm,argv_local[2],_S_in);
        if ((*(byte *)((long)&lm.p_wordpadding1 +
                      *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
          __assert_fail("in",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                        ,0x1ff,"int main(int, char **)");
        }
        iVar8 = 0;
        iVar9 = 0;
        while( true ) {
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&lm,(string *)&line);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
            poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,iVar9);
            poVar3 = std::operator<<(poVar3," lines, ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
            std::operator<<(poVar3," tokens\n");
            poVar3 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
            poVar3 = (ostream *)
                     std::ostream::operator<<
                               (poVar3,(float)(int)fname._M_dataplus._M_p / (float)total);
            std::operator<<(poVar3,"\n");
            std::ifstream::~ifstream(&lm);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
            poVar3 = std::operator<<((ostream *)&os,"ordered");
            poVar3 = std::operator<<(poVar3,'_');
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,'_');
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,'_');
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,"-pid");
            _Var2 = getpid();
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,_Var2);
            std::operator<<(poVar3,".params");
            std::__cxx11::stringbuf::str();
            poVar3 = std::operator<<((ostream *)&std::cerr,"Parameters will be written to: ");
            poVar3 = std::operator<<(poVar3,(string *)&fname);
            std::endl<char,std::char_traits<char>>(poVar3);
            model.all_params.
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            model.lookup_params.
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            model.gradient_norm_scratch = (float *)0x0;
            model.all_params.
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            model.all_params.
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
            _M_impl.super__Vector_impl_data =
                 (_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>)0x0;
            model.lookup_params.
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            model.lookup_params.
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_908 = (MomentumSGDTrainer *)operator_new(0x70);
            cnn::MomentumSGDTrainer::MomentumSGDTrainer(local_908,&model,1e-06,0.01,0.9);
            RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel(&lm,&model);
            if (argc_local == 4) {
              std::__cxx11::string::string((string *)&total,argv_local[3],(allocator *)&in_2);
              std::ifstream::ifstream(&in_2,(string *)&total,_S_in);
              boost::archive::text_iarchive::text_iarchive((text_iarchive *)&y,(istream *)&in_2,0);
              boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::
              load_standard::invoke<cnn::Model>((text_iarchive *)&y,&model);
              boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
                        ((text_iarchive_impl<boost::archive::text_iarchive> *)&y);
              std::ifstream::~ifstream(&in_2);
              std::__cxx11::string::~string((string *)&total);
            }
            __n = ((long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x48;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&order,__n,(allocator_type *)&in_2);
            for (uVar6 = 0;
                (ulong)uVar6 <
                (ulong)((long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar6 = uVar6 + 1) {
              order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] = uVar6;
            }
            bVar7 = true;
            local_8fc = 0;
            local_900 = 0;
            local_8d0 = -9e+99;
            do {
              std::__cxx11::string::string((string *)&in_2,"completed in",(allocator *)&y);
              cnn::Timer::Timer((Timer *)&total,(string *)&in_2);
              std::__cxx11::string::~string((string *)&in_2);
              tpredict = 0;
              toverall = 0;
              correct = 0.0;
              local_900 = local_900 + 0x32;
              local_918 = 0.0;
              iVar8 = 0x32;
              while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
                if (((long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x48 == (__n & 0xffffffff)) {
                  if (!bVar7) {
                    cnn::Trainer::update_epoch(&local_908->super_Trainer,1.0);
                  }
                  std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
                  __n = 0;
                  std::
                  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_finish,cnn::rndeng);
                  bVar7 = false;
                }
                cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&in_2);
                uVar6 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[__n & 0xffffffff];
                RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                          ((RNNLanguageModel<cnn::FastLSTMBuilder> *)&y,
                           (vector<int,_std::allocator<int>_> *)&lm,
                           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(training.super__Vector_base<Instance,_std::allocator<Instance>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar6),
                           &training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar6].chars,
                           (ComputationGraph *)
                           &training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar6].labels,(double *)&in_2,
                           (uint *)&correct,&tpredict,SUB81(&toverall,0));
                pTVar5 = cnn::ComputationGraph::forward((ComputationGraph *)&in_2);
                rVar12 = cnn::as_scalar(pTVar5);
                cnn::ComputationGraph::backward((ComputationGraph *)&in_2);
                (*(local_908->super_Trainer)._vptr_Trainer[2])(SUB648(ZEXT464(0x3f800000),0));
                __n = (size_type)((int)__n + 1);
                local_918 = local_918 + (double)rVar12;
                cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&in_2);
              }
              cnn::Trainer::status(&local_908->super_Trainer);
              std::operator<<((ostream *)&std::cerr," E = ");
              auVar11 = vcvtusi2sd_avx512f(in_XMM3,toverall);
              poVar3 = std::ostream::_M_insert<double>(local_918 / auVar11._0_8_);
              std::operator<<(poVar3," ppl=");
              auVar11 = vcvtusi2sd_avx512f(in_XMM3,toverall);
              dVar13 = exp(local_918 / auVar11._0_8_);
              poVar3 = std::ostream::_M_insert<double>(dVar13);
              std::operator<<(poVar3," (acc=");
              auVar11 = vcvtusi2sd_avx512f(in_XMM3,toverall);
              poVar3 = std::ostream::_M_insert<double>(correct / auVar11._0_8_);
              std::operator<<(poVar3,") ");
              pIVar1 = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              local_8fc = local_8fc + 1;
              if (local_8fc % 0x19 == 0) {
                dpredict = 0;
                doverall = 0;
                dcorr = 0.0;
                eval = true;
                for (chars = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                             super__Vector_impl_data._M_start; chars != pIVar1; chars = chars + 1) {
                  cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&in_2);
                  RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                            ((RNNLanguageModel<cnn::FastLSTMBuilder> *)&y,
                             (vector<int,_std::allocator<int>_> *)&lm,
                             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)chars,&chars->chars,(ComputationGraph *)&chars->labels,
                             (double *)&in_2,(uint *)&dcorr,&dpredict,SUB81(&doverall,0));
                  pTVar5 = cnn::ComputationGraph::forward((ComputationGraph *)&in_2);
                  cnn::as_scalar(pTVar5);
                  cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&in_2);
                }
                auVar14._8_8_ = dcorr;
                auVar14._0_8_ = dcorr;
                auVar11 = vpinsrd_avx(ZEXT416(dpredict),doverall,1);
                eval = false;
                auVar11 = vcvtudq2pd_avx512vl(auVar11);
                auVar11 = vdivpd_avx(auVar14,auVar11);
                auVar14 = vshufpd_avx(auVar11,auVar11,1);
                dVar13 = auVar14._0_8_;
                dVar15 = auVar11._0_8_;
                local_918 = (dVar15 * (dVar13 + dVar13)) / (dVar13 + dVar15);
                if (local_8d0 < local_918) {
                  std::ofstream::ofstream((ComputationGraph *)&in_2,(string *)&fname,_S_out);
                  boost::archive::text_oarchive::text_oarchive
                            ((text_oarchive *)&y,(ostream *)&in_2,0);
                  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::
                  save_standard::invoke<cnn::Model>((text_oarchive *)&y,&model);
                  boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::
                  ~text_oarchive_impl((text_oarchive_impl<boost::archive::text_oarchive> *)&y);
                  std::ofstream::~ofstream((ComputationGraph *)&in_2);
                  local_8d0 = local_918;
                }
                std::operator<<((ostream *)&std::cerr,"\n***DEV [epoch=");
                auVar11 = vcvtusi2sd_avx512f(in_XMM3,local_900);
                auVar14 = vcvtusi2sd_avx512f(in_XMM3,((long)training.
                                                  super__Vector_base<Instance,_std::allocator<Instance>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)training.
                                                  super__Vector_base<Instance,_std::allocator<Instance>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x48)
                ;
                poVar3 = std::ostream::_M_insert<double>(auVar11._0_8_ / auVar14._0_8_);
                std::operator<<(poVar3,"] P = ");
                poVar3 = std::ostream::_M_insert<double>(dVar15);
                std::operator<<(poVar3," R = ");
                poVar3 = std::ostream::_M_insert<double>(dVar13);
                std::operator<<(poVar3," F=");
                poVar3 = std::ostream::_M_insert<double>(local_918);
                std::operator<<(poVar3,' ');
              }
              cnn::Timer::~Timer((Timer *)&total);
            } while( true );
          }
          y.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          model.all_params.
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          _os = (pointer)0x0;
          y.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          y.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          model.all_params.
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          model.all_params.
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&os,&wd,
                           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)&model,&cd,&y,&ld,(int *)&fname,&total);
          if (-(long)_os >> 2 !=
              ((long)y.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)y.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) break;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::vector(&local_700,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&model);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::vector(&local_718,&y);
          Instance::Instance((Instance *)&in_2,(vector<int,_std::allocator<int>_> *)&os,&local_700,
                             &local_718);
          std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>
                    (&dev,(Instance *)&in_2);
          Instance::~Instance((Instance *)&in_2);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_718);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_700);
          iVar8 = iVar8 + (int)((ulong)-(long)_os >> 2);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&model);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&y);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&os);
          iVar9 = iVar9 + 1;
        }
        __assert_fail("x.size() == y.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                      ,0x206,"int main(int, char **)");
      }
      y.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _os = (pointer)0x0;
      y.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      y.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&os,&wd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&model,&cd,&y,&ld,(int *)&fname,&total);
      if ((-(long)_os >> 2 !=
           ((long)y.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)y.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18) ||
         (-(long)_os >> 2 !=
          ((long)model.all_params.
                 super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)model.all_params.
                super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18)) break;
      if (_os == (pointer)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&line);
        std::endl<char,std::char_traits<char>>(poVar3);
        abort();
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_6d0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_6e8,&y);
      Instance::Instance((Instance *)&in_2,(vector<int,_std::allocator<int>_> *)&os,&local_6d0,
                         &local_6e8);
      std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>
                (&training,(Instance *)&in_2);
      Instance::~Instance((Instance *)&in_2);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_6e8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_6d0);
      iVar8 = iVar8 + (int)((ulong)-(long)_os >> 2);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&y);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&os);
      iVar9 = iVar9 + 1;
    }
    __assert_fail("x.size() == y.size() && x.size() == c.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                  ,0x1e3,"int main(int, char **)");
  }
  __assert_fail("in",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                ,0x1dc,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv, 1989);
  if (argc != 3 && argc != 4) {
    cerr << "Usage: " << argv[0] << " corpus.txt dev.txt [model.params]\n";
    return 1;
  }
  vector<Instance> training,dev;
  string line;

  int tlc = 0;
  int ttoks = 0;
  
  cerr << "Reading training data from " << argv[1] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[1]);
    assert(in);
    while(getline(in, line)) {
      ++tlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size() && x.size() == c.size());
      if (x.size() == 0) { cerr << line << endl; abort(); }
      training.push_back(Instance(x,c,y));
      ttoks += x.size();
    }
    cerr << tlc << " lines, " << ttoks << " tokens, " << wd.size() << " types\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
    cerr << "Tags: " << ld.size() << endl;
  }
  wd.Freeze();
  wd.SetUnk("*UNK*");
  endlabel = ld.Convert("NULL");
  cd.Freeze();
  ld.Freeze(); // no new tag types allowed

  cd.SetUnk("*UNK*");
  ld.SetUnk("*UNK*");  
  VOCAB_SIZE = wd.size();
  CHAR_SIZE = cd.size();
  LABEL_SIZE = ld.size();

  int dlc = 0;
  int dtoks = 0;
  cerr << "Reading dev data from " << argv[2] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[2]);
    assert(in);
    while(getline(in, line)) {
      ++dlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size());
      dev.push_back(Instance(x,c,y));
      dtoks += x.size();
    }
    cerr << dlc << " lines, " << dtoks << " tokens\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
  }
  ostringstream os;
  os << "ordered"
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << "-pid" << getpid() << ".params";
  const string fname = os.str();
  cerr << "Parameters will be written to: " << fname << endl;
  double best = -9e+99;

  Model model;
  bool use_momentum = true;
  Trainer* sgd = nullptr;
  if (use_momentum)
    sgd = new MomentumSGDTrainer(&model);
  else
    sgd = new SimpleSGDTrainer(&model);

  RNNLanguageModel<FastLSTMBuilder> lm(model);
  //RNNLanguageModel<SimpleRNNBuilder> lm(model);
  if (argc == 4) {
    string fname = argv[3];
    ifstream in(fname);
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  unsigned report_every_i = 50;
  unsigned dev_every_i_reports = 25;
  unsigned si = training.size();
  vector<unsigned> order(training.size());
  for (unsigned i = 0; i < order.size(); ++i) order[i] = i;
  bool first = true;
  int report = 0;
  unsigned lines = 0;
  while(1) {
    Timer iteration("completed in");
    double loss = 0;
    unsigned tpredict = 0;
    unsigned toverall = 0;
    double correct = 0;
    for (unsigned i = 0; i < report_every_i; ++i) {
      if (si == training.size()) {
        si = 0;
        if (first) { first = false; } else { sgd->update_epoch(); }
        cerr << "**SHUFFLE\n";
        shuffle(order.begin(), order.end(), *rndeng);
      }

      // build graph for this instance
      ComputationGraph cg;
      auto& sent = training[order[si]];
//      cerr<<si<<" "<<order[si]<<endl;
//      sent.show();
      ++si;
      lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, cg, &correct, &tpredict, &toverall, true);
//      cerr<<"done"<<endl;
      loss += as_scalar(cg.forward());
      cg.backward();
      sgd->update(1.0);
      ++lines;
    }
    sgd->status();
    cerr << " E = " << (loss / toverall) << " ppl=" << exp(loss / toverall) << " (acc=" << (correct / toverall) << ") ";

    // show score on dev data?
    report++;
    if (report % dev_every_i_reports == 0) {
      double dloss = 0;
      unsigned dpredict = 0;
      unsigned doverall = 0;
      double dcorr = 0;
      eval = true;
      //lm.p_th2t->scale_parameters(pdrop);
      for (auto& sent : dev) {
        ComputationGraph cg;
        lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, cg, &dcorr, &dpredict, &doverall, false);
        dloss += as_scalar(cg.forward());
      }
      //lm.p_th2t->scale_parameters(1/pdrop);
      eval = false;
      double P = (dcorr / dpredict);
      double R = (dcorr / doverall);
      double F = 2*P*R / (P+R);
      if (F > best) {
        best = F;
        ofstream out(fname);
        boost::archive::text_oarchive oa(out);
        oa << model;
      }
      cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] P = " << P << " R = " << R << " F=" << F << ' ';
    }
  }
  delete sgd;
}